

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_slt_8_pi7(void)

{
  uint address;
  
  address = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,
                   (uint)(int)(char)((byte)m68ki_cpu.v_flag ^ (byte)m68ki_cpu.n_flag) >> 7 & 0xff);
  return;
}

Assistant:

static void m68k_op_slt_8_pi7(void)
{
	m68ki_write_8(EA_A7_PI_8(), COND_LT() ? 0xff : 0);
}